

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::IsOn(cmMakefile *this,string *name)

{
  bool bVar1;
  cmValue val;
  string *name_local;
  cmMakefile *this_local;
  
  val = GetDefinition(this,name);
  bVar1 = cmIsOn(val);
  return bVar1;
}

Assistant:

bool cmMakefile::IsOn(const std::string& name) const
{
  return cmIsOn(this->GetDefinition(name));
}